

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase28::run(TestCase28 *this)

{
  bool bVar1;
  int local_124;
  bool local_11d;
  int local_11c;
  bool _kj_shouldLog_3;
  DebugExpression<int_&> DStack_118;
  undefined1 local_110 [8];
  DebugComparison<int_&,_int> _kjCondition_3;
  bool local_dd;
  int local_dc;
  int iStack_d8;
  bool _kj_shouldLog_2;
  DebugExpression<int> local_d4;
  undefined1 local_d0 [8];
  DebugComparison<int,_int> _kjCondition_2;
  bool local_a5;
  int local_a4;
  int iStack_a0;
  bool _kj_shouldLog_1;
  DebugExpression<int> local_9c;
  undefined1 local_98 [8];
  DebugComparison<int,_int> _kjCondition_1;
  int local_70;
  bool local_69;
  int local_68;
  bool _kj_shouldLog;
  int local_58;
  DebugExpression<int> local_54;
  undefined1 local_50 [8];
  DebugComparison<int,_int> _kjCondition;
  undefined1 local_28 [8];
  Function<int_(int,_int)> f;
  int i;
  TestCase28 *this_local;
  
  f.impl.ptr._4_4_ = 0;
  _kjCondition._24_8_ = (long)&f.impl.ptr + 4;
  Function<int(int,int)>::Function<kj::(anonymous_namespace)::TestCase28::run()::__0>
            ((Function<int(int,int)> *)local_28,(Type *)&_kjCondition.result);
  local_58 = 0x243;
  local_54 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  local_68 = Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,0x7b,0x1c8);
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_50,&local_54,&local_68)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    local_69 = kj::_::Debug::shouldLog(ERROR);
    while (local_69 != false) {
      local_70 = 0x243;
      _kjCondition_1._28_4_ =
           Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,0x7b,0x1c8);
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x21,ERROR,
                 "\"failed: expected \" \"(123 + 456) == (f(123, 456))\", _kjCondition, 123 + 456, f(123, 456)"
                 ,(char (*) [46])"failed: expected (123 + 456) == (f(123, 456))",
                 (DebugComparison<int,_int> *)local_50,&local_70,(int *)&_kjCondition_1.field_0x1c);
      local_69 = false;
    }
  }
  iStack_a0 = 0x10;
  local_9c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff60);
  local_a4 = Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,7,8);
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_98,&local_9c,&local_a4)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
  if (!bVar1) {
    local_a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_a5 != false) {
      _kjCondition_2._28_4_ = 0x10;
      _kjCondition_2._24_4_ =
           Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,7,8);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x22,ERROR,
                 "\"failed: expected \" \"(7 + 8 + 1) == (f(7, 8))\", _kjCondition, 7 + 8 + 1, f(7, 8)"
                 ,(char (*) [42])"failed: expected (7 + 8 + 1) == (f(7, 8))",
                 (DebugComparison<int,_int> *)local_98,(int *)&_kjCondition_2.field_0x1c,
                 (int *)&_kjCondition_2.result);
      local_a5 = false;
    }
  }
  iStack_d8 = 0xd;
  local_d4 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff28);
  local_dc = Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,2,9);
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_d0,&local_d4,&local_dc)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
  if (!bVar1) {
    local_dd = kj::_::Debug::shouldLog(ERROR);
    while (local_dd != false) {
      _kjCondition_3._36_4_ = 0xd;
      _kjCondition_3._32_4_ =
           Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,2,9);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x23,ERROR,
                 "\"failed: expected \" \"(9 + 2 + 2) == (f(2, 9))\", _kjCondition, 9 + 2 + 2, f(2, 9)"
                 ,(char (*) [42])"failed: expected (9 + 2 + 2) == (f(2, 9))",
                 (DebugComparison<int,_int> *)local_d0,(int *)&_kjCondition_3.field_0x24,
                 (int *)&_kjCondition_3.result);
      local_dd = false;
    }
  }
  DStack_118 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (int *)((long)&f.impl.ptr + 4));
  local_11c = 3;
  kj::_::DebugExpression<int&>::operator==
            ((DebugComparison<int_&,_int> *)local_110,
             (DebugExpression<int&> *)&stack0xfffffffffffffee8,&local_11c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_110);
  if (!bVar1) {
    local_11d = kj::_::Debug::shouldLog(ERROR);
    while (local_11d != false) {
      local_124 = 3;
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int&,int>&,int&,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x25,ERROR,"\"failed: expected \" \"(i) == (3)\", _kjCondition, i, 3",
                 (char (*) [28])"failed: expected (i) == (3)",
                 (DebugComparison<int_&,_int> *)local_110,(int *)((long)&f.impl.ptr + 4),&local_124)
      ;
      local_11d = false;
    }
  }
  Function<int_(int,_int)>::~Function((Function<int_(int,_int)> *)local_28);
  return;
}

Assistant:

TEST(Function, Lambda) {
  int i = 0;

  Function<int(int, int)> f = [&](int a, int b) { return a + b + i++; };

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9 + 2 + 2, f(2, 9));

  EXPECT_EQ(i, 3);
}